

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sesschan.c
# Opt level: O1

_Bool sesschan_allocate_pty
                (long chan,void *param_2,size_t param_3,undefined4 width,undefined4 height,
                undefined4 pixwidth,undefined4 pixheight)

{
  byte bVar1;
  char *value;
  ptrlen pl;
  
  bVar1 = *(byte *)(chan + -0x5a0);
  if (bVar1 == 0) {
    pl.len = param_3;
    pl.ptr = param_2;
    value = mkstr(pl);
    conf_set_str(*(Conf **)(chan + -0x5c0),0x35,value);
    safefree(value);
    *(undefined1 *)(chan + -0x5a0) = 1;
    memcpy((void *)(chan + -0x59c),&stack0x00000010,0x50c);
    *(undefined4 *)(chan + -0x90) = width;
    *(undefined4 *)(chan + -0x8c) = height;
    *(undefined4 *)(chan + -0x88) = pixwidth;
    *(undefined4 *)(chan + -0x84) = pixheight;
  }
  return (_Bool)(bVar1 ^ 1);
}

Assistant:

bool sesschan_allocate_pty(
    Channel *chan, ptrlen termtype, unsigned width, unsigned height,
    unsigned pixwidth, unsigned pixheight, struct ssh_ttymodes modes)
{
    sesschan *sess = container_of(chan, sesschan, chan);
    char *s;

    if (sess->want_pty)
        return false;

    s = mkstr(termtype);
    conf_set_str(sess->conf, CONF_termtype, s);
    sfree(s);

    sess->want_pty = true;
    sess->ttymodes  = modes;
    sess->wc = width;
    sess->hc = height;
    sess->wp = pixwidth;
    sess->hp = pixheight;

    return true;
}